

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_schema_nodeid
              (char *nodeid,lys_node *start_parent,lys_module *cur_module,ly_set **ret,int extended,
              int no_node_error)

{
  ly_ctx *ctx_00;
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ly_set *plVar5;
  lys_node *plVar6;
  lys_node *plVar7;
  int *local_110;
  lys_module *local_f0;
  int *local_d8;
  ly_ctx *ctx;
  char *str;
  lys_module *aux_mod;
  lys_module *start_mod;
  int local_a0;
  int backup_mod_name_len;
  int yang_data_name_len;
  int nodeid_end;
  int has_predicate;
  int all_desc;
  int is_relative;
  int mod_name_len;
  int nam_len;
  int r;
  lys_node_augment *last_aug;
  lys_node *elem;
  lys_node *next;
  lys_node *sibling;
  char *yang_data_name;
  char *backup_mod_name;
  char *id;
  char *mod_name;
  char *name;
  int no_node_error_local;
  int extended_local;
  ly_set **ret_local;
  lys_module *cur_module_local;
  lys_node *start_parent_local;
  char *nodeid_local;
  
  yang_data_name = (char *)0x0;
  sibling = (lys_node *)0x0;
  all_desc = 0;
  has_predicate = -1;
  backup_mod_name_len = 0;
  start_mod._4_4_ = 0;
  str = (char *)0x0;
  name._0_4_ = no_node_error;
  name._4_4_ = extended;
  _no_node_error_local = ret;
  ret_local = (ly_set **)cur_module;
  cur_module_local = (lys_module *)start_parent;
  start_parent_local = (lys_node *)nodeid;
  if ((nodeid == (char *)0x0) ||
     (((start_parent == (lys_node *)0x0 && (cur_module == (lys_module *)0x0)) ||
      (ret == (ly_set **)0x0)))) {
    __assert_fail("nodeid && (start_parent || cur_module) && ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x766,
                  "int resolve_schema_nodeid(const char *, const struct lys_node *, const struct lys_module *, struct ly_set **, int, int)"
                 );
  }
  *ret = (ly_set *)0x0;
  if (cur_module == (lys_module *)0x0) {
    ret_local = (ly_set **)lys_node_module(start_parent);
  }
  ctx_00 = (ly_ctx *)*ret_local;
  backup_mod_name = (char *)start_parent_local;
  mod_name_len = parse_schema_nodeid((char *)start_parent_local,&id,&all_desc,&mod_name,&is_relative
                                     ,&has_predicate,(int *)0x0,(int *)0x0,1);
  if (mod_name_len < 1) {
    ly_vlog(ctx_00,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
            (ulong)(uint)(int)backup_mod_name[-mod_name_len],backup_mod_name + -mod_name_len);
  }
  else {
    if (*mod_name == '#') {
      if (has_predicate != 0) {
        ly_vlog(ctx_00,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,0x23,mod_name);
        return -1;
      }
      sibling = (lys_node *)(mod_name + 1);
      local_a0 = is_relative + -1;
      yang_data_name = id;
      start_mod._4_4_ = all_desc;
      backup_mod_name = backup_mod_name + mod_name_len;
    }
    else {
      has_predicate = -1;
    }
    if (name._4_4_ == 0) {
      local_d8 = (int *)0x0;
    }
    else {
      local_d8 = &nodeid_end;
    }
    mod_name_len = parse_schema_nodeid(backup_mod_name,&id,&all_desc,&mod_name,&is_relative,
                                       &has_predicate,&yang_data_name_len,local_d8,name._4_4_);
    if (mod_name_len < 1) {
      ly_vlog(ctx_00,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
              (ulong)(uint)(int)backup_mod_name[-mod_name_len],backup_mod_name + -mod_name_len);
    }
    else {
      backup_mod_name = backup_mod_name + mod_name_len;
      if (yang_data_name != (char *)0x0) {
        id = yang_data_name;
        all_desc = start_mod._4_4_;
      }
      if ((has_predicate == 0) || (cur_module_local != (lys_module *)0x0)) {
        if (has_predicate != 0) {
          ret_local = (ly_set **)lys_node_module((lys_node *)cur_module_local);
          aux_mod = (lys_module *)ret_local;
LAB_001170b9:
          next = (lys_node *)0x0;
          _nam_len = (lys_module *)0x0;
          if (cur_module_local == (lys_module *)0x0) goto LAB_001171d0;
          if ((id == (char *)0x0) ||
             ((iVar2 = strncmp(id,(char *)ret_local[1],(long)all_desc), iVar1 = all_desc, iVar2 == 0
              && (sVar3 = strlen((char *)ret_local[1]), iVar1 == (int)sVar3)))) {
            str = (char *)ret_local;
          }
          else {
            str = (char *)lyp_get_module((lys_module *)ret_local,(char *)0x0,0,id,all_desc,0);
            if ((lys_module *)str == (lys_module *)0x0) {
              pcVar4 = strndup(id,(long)all_desc);
              ly_vlog(ctx_00,LYE_PATH_INMOD,LY_VLOG_STR,pcVar4);
              free(pcVar4);
              return -1;
            }
          }
          if (name._4_4_ != 0) goto LAB_001171d0;
LAB_001171b4:
          _nam_len = (lys_module *)
                     lys_getnext_target_aug
                               ((lys_node_augment *)_nam_len,(lys_module *)str,
                                (lys_node *)cur_module_local);
LAB_001171d0:
          if (_nam_len == (lys_module *)0x0) {
            local_f0 = cur_module_local;
          }
          else {
            local_f0 = _nam_len;
          }
          next = lys_getnext(next,(lys_node *)local_f0,aux_mod,0x18b);
          if (next != (lys_node *)0x0) {
            mod_name_len = schema_nodeid_siblingcheck
                                     (next,(lys_module *)ret_local,id,all_desc,mod_name,is_relative)
            ;
            if ((name._4_4_ != 0) &&
               ((((mod_name_len == 0 || (mod_name_len == 2)) || (mod_name_len == 3)) &&
                (yang_data_name_len != 0)))) goto code_r0x0011726a;
            if (*backup_mod_name == '\0') {
              backup_mod_name_len = 1;
            }
            goto LAB_001172bb;
          }
          goto LAB_001176d7;
        }
        aux_mod = lyp_get_module((lys_module *)ret_local,(char *)0x0,0,id,all_desc,0);
        if (aux_mod == (lys_module *)0x0) {
          pcVar4 = strndup(id,(long)all_desc);
          ly_vlog(ctx_00,LYE_PATH_INMOD,LY_VLOG_STR,pcVar4);
          free(pcVar4);
        }
        else {
          cur_module_local = (lys_module *)0x0;
          if ((sibling == (lys_node *)0x0) ||
             (cur_module_local =
                   (lys_module *)lyp_get_yang_data_template(aux_mod,(char *)sibling,local_a0),
             cur_module_local != (lys_module *)0x0)) goto LAB_001170b9;
          pcVar4 = strndup((char *)start_parent_local,
                           (long)sibling + ((long)local_a0 - (long)start_parent_local));
          ly_vlog(ctx_00,LYE_PATH_INNODE,LY_VLOG_STR,pcVar4);
          free(pcVar4);
        }
      }
      else {
        ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_STR,start_parent_local,
                "Starting node must be provided for relative paths.");
      }
    }
  }
  return -1;
code_r0x0011726a:
  mod_name_len = resolve_extended_schema_nodeid_predicate
                           (backup_mod_name,next,(lys_module *)ret_local,&backup_mod_name_len);
  if (mod_name_len == 1) goto LAB_001171d0;
  if (mod_name_len == -1) {
    return -1;
  }
LAB_001172bb:
  if (mod_name_len != 0) {
    if (mod_name_len != 1) {
      if (mod_name_len == 2) {
        if (*_no_node_error_local == (ly_set *)0x0) {
          plVar5 = ly_set_new();
          *_no_node_error_local = plVar5;
          if (*_no_node_error_local == (ly_set *)0x0) {
            ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "resolve_schema_nodeid");
            return -1;
          }
        }
        ly_set_add(*_no_node_error_local,next,1);
        if (nodeid_end != 0) {
          elem = next;
LAB_001173ee:
          last_aug = (lys_node_augment *)elem;
          if (elem != (lys_node *)0x0) {
            if (elem != next) {
              ly_set_add(*_no_node_error_local,elem,1);
            }
            if ((last_aug->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
              elem = last_aug->child;
            }
            else {
              elem = (lys_node *)0x0;
            }
            if (elem == (lys_node *)0x0) {
              if ((lys_node *)last_aug == next) goto LAB_001171d0;
              elem = (lys_node *)last_aug->when;
            }
            while (elem == (lys_node *)0x0) {
              if (last_aug->parent->nodetype == LYS_AUGMENT) {
                last_aug = (lys_node_augment *)last_aug->parent->prev;
              }
              else {
                last_aug = (lys_node_augment *)last_aug->parent;
              }
              plVar6 = lys_parent((lys_node *)last_aug);
              plVar7 = lys_parent(next);
              if (plVar6 == plVar7) break;
              elem = (lys_node *)last_aug->when;
            }
            goto LAB_001173ee;
          }
        }
      }
      else {
        if (mod_name_len != 3) {
          ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                 ,0x80e);
          return -1;
        }
        if (*_no_node_error_local == (ly_set *)0x0) {
          plVar5 = ly_set_new();
          *_no_node_error_local = plVar5;
          if (*_no_node_error_local == (ly_set *)0x0) {
            ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "resolve_schema_nodeid");
            return -1;
          }
          if (cur_module_local != (lys_module *)0x0) {
            ly_set_add(*_no_node_error_local,cur_module_local,1);
          }
        }
        ly_set_add(*_no_node_error_local,next,1);
        if (nodeid_end != 0) {
          elem = next;
LAB_00117598:
          last_aug = (lys_node_augment *)elem;
          if (elem != (lys_node *)0x0) {
            if (elem != next) {
              ly_set_add(*_no_node_error_local,elem,1);
            }
            if ((last_aug->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
              elem = last_aug->child;
            }
            else {
              elem = (lys_node *)0x0;
            }
            if (elem == (lys_node *)0x0) {
              if ((lys_node *)last_aug == next) goto LAB_001171d0;
              elem = (lys_node *)last_aug->when;
            }
            while (elem == (lys_node *)0x0) {
              if (last_aug->parent->nodetype == LYS_AUGMENT) {
                last_aug = (lys_node_augment *)last_aug->parent->prev;
              }
              else {
                last_aug = (lys_node_augment *)last_aug->parent;
              }
              plVar6 = lys_parent((lys_node *)last_aug);
              plVar7 = lys_parent(next);
              if (plVar6 == plVar7) break;
              elem = (lys_node *)last_aug->when;
            }
            goto LAB_00117598;
          }
        }
      }
    }
    goto LAB_001171d0;
  }
  if (backup_mod_name_len == 0) {
    if ((next->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
      return -1;
    }
    cur_module_local = (lys_module *)next;
  }
  else {
    plVar5 = ly_set_new();
    *_no_node_error_local = plVar5;
    if (*_no_node_error_local == (ly_set *)0x0) {
      ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","resolve_schema_nodeid");
      return -1;
    }
    ly_set_add(*_no_node_error_local,next,1);
  }
LAB_001176d7:
  if ((name._4_4_ != 0) && (yang_data_name_len != 0)) {
    for (; *backup_mod_name == '['; backup_mod_name = backup_mod_name + 1) {
      backup_mod_name = strchr(backup_mod_name,0x5d);
      if (backup_mod_name == (char *)0x0) {
        ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
               ,0x818);
        return -1;
      }
    }
  }
  if ((backup_mod_name_len != 0) &&
     (((mod_name_len == 0 || (mod_name_len == 2)) || (mod_name_len == 3)))) {
    return 0;
  }
  if (next != (lys_node *)0x0) goto LAB_00117806;
  if (_nam_len == (lys_module *)0x0) {
    if ((int)name != 0) {
      pcVar4 = strndup((char *)start_parent_local,
                       (size_t)(mod_name + ((long)is_relative - (long)start_parent_local)));
      ly_vlog(ctx_00,LYE_PATH_INNODE,LY_VLOG_STR,pcVar4);
      free(pcVar4);
      return -1;
    }
    *_no_node_error_local = (ly_set *)0x0;
    return 0;
  }
  goto LAB_001171b4;
LAB_00117806:
  if (name._4_4_ == 0) {
    local_110 = (int *)0x0;
  }
  else {
    local_110 = &nodeid_end;
  }
  mod_name_len = parse_schema_nodeid(backup_mod_name,&id,&all_desc,&mod_name,&is_relative,
                                     &has_predicate,&yang_data_name_len,local_110,name._4_4_);
  if (mod_name_len < 1) {
    ly_vlog(ctx_00,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
            (ulong)(uint)(int)backup_mod_name[-mod_name_len],backup_mod_name + -mod_name_len);
    return -1;
  }
  backup_mod_name = backup_mod_name + mod_name_len;
  goto LAB_001170b9;
}

Assistant:

int
resolve_schema_nodeid(const char *nodeid, const struct lys_node *start_parent, const struct lys_module *cur_module,
                      struct ly_set **ret, int extended, int no_node_error)
{
    const char *name, *mod_name, *id, *backup_mod_name = NULL, *yang_data_name = NULL;
    const struct lys_node *sibling, *next, *elem;
    struct lys_node_augment *last_aug;
    int r, nam_len, mod_name_len = 0, is_relative = -1, all_desc, has_predicate, nodeid_end = 0;
    int yang_data_name_len, backup_mod_name_len = 0;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *start_mod, *aux_mod = NULL;
    char *str;
    struct ly_ctx *ctx;

    assert(nodeid && (start_parent || cur_module) && ret);
    *ret = NULL;

    if (!cur_module) {
        cur_module = lys_node_module(start_parent);
    }
    ctx = cur_module->ctx;
    id = nodeid;

    r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1);
    if (r < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return -1;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            return -1;
        }
        yang_data_name = name + 1;
        yang_data_name_len = nam_len - 1;
        backup_mod_name = mod_name;
        backup_mod_name_len = mod_name_len;
        id += r;
    } else {
        is_relative = -1;
    }

    r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate,
                            (extended ? &all_desc : NULL), extended);
    if (r < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return -1;
    }
    id += r;

    if (backup_mod_name) {
        mod_name = backup_mod_name;
        mod_name_len = backup_mod_name_len;
    }

    if (is_relative && !start_parent) {
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_STR, nodeid, "Starting node must be provided for relative paths.");
        return -1;
    }

    /* descendant-schema-nodeid */
    if (is_relative) {
        cur_module = start_mod = lys_node_module(start_parent);

    /* absolute-schema-nodeid */
    } else {
        start_mod = lyp_get_module(cur_module, NULL, 0, mod_name, mod_name_len, 0);
        if (!start_mod) {
            str = strndup(mod_name, mod_name_len);
            LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return -1;
        }
        start_parent = NULL;
        if (yang_data_name) {
            start_parent = lyp_get_yang_data_template(start_mod, yang_data_name, yang_data_name_len);
            if (!start_parent) {
                str = strndup(nodeid, (yang_data_name + yang_data_name_len) - nodeid);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return -1;
            }
        }
    }

    while (1) {
        sibling = NULL;
        last_aug = NULL;

        if (start_parent) {
            if (mod_name && (strncmp(mod_name, cur_module->name, mod_name_len)
                    || (mod_name_len != (signed)strlen(cur_module->name)))) {
                /* we are getting into another module (augment) */
                aux_mod = lyp_get_module(cur_module, NULL, 0, mod_name, mod_name_len, 0);
                if (!aux_mod) {
                    str = strndup(mod_name, mod_name_len);
                    LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
                    free(str);
                    return -1;
                }
            } else {
                /* there is no mod_name, so why are we checking augments again?
                 * because this module may be not implemented and it augments something in another module and
                 * there is another augment augmenting that previous one */
                aux_mod = cur_module;
            }

            /* look into augments */
            if (!extended) {
get_next_augment:
                last_aug = lys_getnext_target_aug(last_aug, aux_mod, start_parent);
            }
        }

        while ((sibling = lys_getnext(sibling, (last_aug ? (struct lys_node *)last_aug : start_parent), start_mod,
                LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT | LYS_GETNEXT_PARENTUSES | LYS_GETNEXT_NOSTATECHECK))) {
            r = schema_nodeid_siblingcheck(sibling, cur_module, mod_name, mod_name_len, name, nam_len);

            /* resolve predicate */
            if (extended && ((r == 0) || (r == 2) || (r == 3)) && has_predicate) {
                r = resolve_extended_schema_nodeid_predicate(id, sibling, cur_module, &nodeid_end);
                if (r == 1) {
                    continue;
                } else if (r == -1) {
                    return -1;
                }
            } else if (!id[0]) {
                nodeid_end = 1;
            }

            if (r == 0) {
                /* one matching result */
                if (nodeid_end) {
                    *ret = ly_set_new();
                    LY_CHECK_ERR_RETURN(!*ret, LOGMEM(ctx), -1);
                    ly_set_add(*ret, (void *)sibling, LY_SET_OPT_USEASLIST);
                } else {
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        return -1;
                    }
                    start_parent = sibling;
                }
                break;
            } else if (r == 1) {
                continue;
            } else if (r == 2) {
                /* "*" */
                if (!*ret) {
                    *ret = ly_set_new();
                    LY_CHECK_ERR_RETURN(!*ret, LOGMEM(ctx), -1);
                }
                ly_set_add(*ret, (void *)sibling, LY_SET_OPT_USEASLIST);
                if (all_desc) {
                    LY_TREE_DFS_BEGIN(sibling, next, elem) {
                        if (elem != sibling) {
                            ly_set_add(*ret, (void *)elem, LY_SET_OPT_USEASLIST);
                        }

                        LY_TREE_DFS_END(sibling, next, elem);
                    }
                }
            } else if (r == 3) {
                /* "." */
                if (!*ret) {
                    *ret = ly_set_new();
                    LY_CHECK_ERR_RETURN(!*ret, LOGMEM(ctx), -1);
                    if (start_parent) {
                        ly_set_add(*ret, (void *)start_parent, LY_SET_OPT_USEASLIST);
                    }
                }
                ly_set_add(*ret, (void *)sibling, LY_SET_OPT_USEASLIST);
                if (all_desc) {
                    LY_TREE_DFS_BEGIN(sibling, next, elem) {
                        if (elem != sibling) {
                            ly_set_add(*ret, (void *)elem, LY_SET_OPT_USEASLIST);
                        }

                        LY_TREE_DFS_END(sibling, next, elem);
                    }
                }
            } else {
                LOGINT(ctx);
                return -1;
            }
        }

        /* skip predicate */
        if (extended && has_predicate) {
            while (id[0] == '[') {
                id = strchr(id, ']');
                if (!id) {
                    LOGINT(ctx);
                    return -1;
                }
                ++id;
            }
        }

        if (nodeid_end && ((r == 0) || (r == 2) || (r == 3))) {
            return EXIT_SUCCESS;
        }

        /* no match */
        if (!sibling) {
            if (last_aug) {
                /* it still could be in another augment */
                goto get_next_augment;
            }
            if (no_node_error) {
                str = strndup(nodeid, (name - nodeid) + nam_len);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return -1;
            }
            *ret = NULL;
            return EXIT_SUCCESS;
        }

        r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate,
                                (extended ? &all_desc : NULL), extended);
        if (r < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            return -1;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT(ctx);
    return -1;
}